

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::ConfigureSubDirectory(cmMakefile *this,cmMakefile *mf)

{
  bool bVar1;
  PolicyStatus PVar2;
  string *psVar3;
  ostream *poVar4;
  PolicyID id;
  PolicyID id_00;
  string sStack_1e8;
  string currentStart;
  string currentStartFile;
  string msg;
  
  InitializeFromParent(mf,this);
  psVar3 = GetCurrentSourceDirectory_abi_cxx11_(mf);
  std::__cxx11::string::string((string *)&currentStart,(string *)psVar3);
  if (this->GlobalGenerator->CMakeInstance->DebugOutput == true) {
    cmStrCat<char_const(&)[25],std::__cxx11::string&>
              (&msg,(char (*) [25])"   Entering             ",&currentStart);
    cmSystemTools::Message(&msg,(char *)0x0);
    std::__cxx11::string::~string((string *)&msg);
  }
  cmStrCat<std::__cxx11::string&,char_const(&)[16]>
            (&currentStartFile,&currentStart,(char (*) [16])"/CMakeLists.txt");
  bVar1 = cmsys::SystemTools::FileExists(&currentStartFile,true);
  if (bVar1) {
    Configure(mf);
    if (this->GlobalGenerator->CMakeInstance->DebugOutput == true) {
      psVar3 = GetCurrentSourceDirectory_abi_cxx11_(this);
      cmStrCat<char_const(&)[25],std::__cxx11::string_const&>
                (&msg,(char (*) [25])"   Returning to         ",psVar3);
      cmSystemTools::Message(&msg,(char *)0x0);
      std::__cxx11::string::~string((string *)&msg);
    }
    goto LAB_00299e99;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  poVar4 = std::operator<<((ostream *)&msg,"The source directory\n");
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = std::operator<<(poVar4,(string *)&currentStart);
  poVar4 = std::operator<<(poVar4,"\n");
  std::operator<<(poVar4,"does not contain a CMakeLists.txt file.");
  PVar2 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0014,false);
  if (PVar2 - REQUIRED_IF_USED < 2) {
    poVar4 = std::operator<<((ostream *)&msg,"\n");
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&sStack_1e8,(cmPolicies *)0xe,id);
    std::operator<<(poVar4,(string *)&sStack_1e8);
    std::__cxx11::string::~string((string *)&sStack_1e8);
LAB_00299ddf:
    std::__cxx11::stringbuf::str();
    IssueMessage(this,FATAL_ERROR,&sStack_1e8);
LAB_00299e87:
    std::__cxx11::string::~string((string *)&sStack_1e8);
  }
  else {
    if (PVar2 == WARN) {
      poVar4 = std::operator<<((ostream *)&msg,"\n");
      poVar4 = std::operator<<(poVar4,"CMake does not support this case but it used ");
      poVar4 = std::operator<<(poVar4,"to work accidentally and is being allowed for ");
      poVar4 = std::operator<<(poVar4,"compatibility.");
      poVar4 = std::operator<<(poVar4,"\n");
      cmPolicies::GetPolicyWarning_abi_cxx11_(&sStack_1e8,(cmPolicies *)0xe,id_00);
      std::operator<<(poVar4,(string *)&sStack_1e8);
      std::__cxx11::string::~string((string *)&sStack_1e8);
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,&sStack_1e8);
      goto LAB_00299e87;
    }
    if (PVar2 == NEW) goto LAB_00299ddf;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
LAB_00299e99:
  std::__cxx11::string::~string((string *)&currentStartFile);
  std::__cxx11::string::~string((string *)&currentStart);
  return;
}

Assistant:

void cmMakefile::ConfigureSubDirectory(cmMakefile* mf)
{
  mf->InitializeFromParent(this);
  std::string currentStart = mf->GetCurrentSourceDirectory();
  if (this->GetCMakeInstance()->GetDebugOutput()) {
    std::string msg = cmStrCat("   Entering             ", currentStart);
    cmSystemTools::Message(msg);
  }

  std::string const currentStartFile =
    cmStrCat(currentStart, "/CMakeLists.txt");
  if (!cmSystemTools::FileExists(currentStartFile, true)) {
    // The file is missing.  Check policy CMP0014.
    std::ostringstream e;
    /* clang-format off */
    e << "The source directory\n"
      << "  " << currentStart << "\n"
      << "does not contain a CMakeLists.txt file.";
    /* clang-format on */
    switch (this->GetPolicyStatus(cmPolicies::CMP0014)) {
      case cmPolicies::WARN:
        // Print the warning.
        /* clang-format off */
        e << "\n"
          << "CMake does not support this case but it used "
          << "to work accidentally and is being allowed for "
          << "compatibility."
          << "\n"
          << cmPolicies::GetPolicyWarning(cmPolicies::CMP0014);
        /* clang-format on */
        this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0014);
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior prints the error.
        this->IssueMessage(MessageType::FATAL_ERROR, e.str());
        break;
    }
    return;
  }
  // finally configure the subdir
  mf->Configure();

  if (this->GetCMakeInstance()->GetDebugOutput()) {
    std::string msg =
      cmStrCat("   Returning to         ", this->GetCurrentSourceDirectory());
    cmSystemTools::Message(msg);
  }
}